

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_OpProto * __thiscall
ZCCCompiler::PromoteUnary(ZCCCompiler *this,EZCCExprType op,ZCC_Expression **expr)

{
  ZCC_Expression *expr_00;
  ZCC_OpProto *pZVar1;
  int routelen;
  Conversion *route [8];
  int local_6c;
  Conversion *local_68 [9];
  
  if ((*expr)->Type == &TypeError->super_PType) {
    pZVar1 = (ZCC_OpProto *)0x0;
  }
  else {
    local_6c = 8;
    pZVar1 = ZCC_OpInfoType::FindBestProto(ZCC_OpInfo + op,(*expr)->Type,local_68,&local_6c);
    if (pZVar1 != (ZCC_OpProto *)0x0) {
      expr_00 = *expr;
      ApplyConversion(this,expr_00,local_68,local_6c);
      *expr = expr_00;
    }
  }
  return pZVar1;
}

Assistant:

ZCC_OpProto *ZCCCompiler::PromoteUnary(EZCCExprType op, ZCC_Expression *&expr)
{
	if (expr->Type == TypeError)
	{
		return NULL;
	}
	const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
	int routelen = countof(route);
	ZCC_OpProto *proto = ZCC_OpInfo[op].FindBestProto(expr->Type, route, routelen);

	if (proto != NULL)
	{
		expr = ApplyConversion(expr, route, routelen);
	}
	return proto;
}